

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  pointer pRVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  char *pcVar13;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar14;
  typed_value<float,_char> *ptVar15;
  size_type sVar16;
  any *paVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  float *pfVar19;
  ostream *poVar20;
  pointer pRVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [16];
  int local_3d4;
  Mat inputImage;
  int *local_390;
  CascadeClassifier cascade;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string inputPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string outputPath;
  string modelPath;
  FileStorage fs;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> detectedFaces;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined8 local_208;
  undefined8 local_200;
  vector local_1f8 [16];
  undefined8 local_1e8;
  _InputArray local_1d8;
  string local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argList;
  undefined8 local_188;
  int local_180;
  int local_17c;
  undefined1 local_178 [2] [16];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_140 [144];
  options_description desc;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&argList,argv,
             argv + argc,(allocator_type *)&vm);
  boost::program_options::variables_map::variables_map(&vm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputImage,"Options for helium",(allocator<char> *)&fs);
  boost::program_options::options_description::options_description
            (&desc,(string *)&inputImage,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&inputImage);
  modelPath._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              ((char *)&modelPath,"help");
  ptVar14 = boost::program_options::value<std::__cxx11::string>();
  ptVar14->m_required = true;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"input",(char *)ptVar14);
  ptVar14 = boost::program_options::value<std::__cxx11::string>();
  ptVar14->m_required = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputImage,"out",(allocator<char> *)&local_308);
  ptVar14 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&inputImage);
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"output",(char *)ptVar14);
  ptVar14 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs,"internal",(allocator<char> *)&local_228);
  ptVar14 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&fs);
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"model",(char *)ptVar14);
  ptVar15 = boost::program_options::value<float>();
  outputPath._M_dataplus._M_p._0_4_ = 0x40000000;
  ptVar15 = boost::program_options::typed_value<float,_char>::default_value
                      (ptVar15,(float *)&outputPath);
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"zoom",(char *)ptVar15);
  ptVar15 = boost::program_options::value<float>();
  local_358._M_dataplus._M_p._0_4_ = 0x3d4ccccd;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputPath,"0.05",(allocator<char> *)&local_1c0);
  ptVar15 = boost::program_options::typed_value<float,_char>::default_value
                      (ptVar15,(float *)&local_358,&inputPath);
  boost::program_options::options_description_easy_init::operator()
            (pcVar13,(value_semantic *)"min-size",(char *)ptVar15);
  std::__cxx11::string::~string((string *)&inputPath);
  std::__cxx11::string::~string((string *)&fs);
  std::__cxx11::string::~string((string *)&inputImage);
  local_178[0] = (undefined1  [16])0x0;
  local_178[1] = (undefined1  [16])0x0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&inputImage,argc,argv,&desc,0,
             (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_178);
  boost::program_options::store((basic_parsed_options *)&inputImage,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&inputImage);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputImage,"help",(allocator<char> *)&fs);
  sVar16 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_140,(key_type *)&inputImage);
  std::__cxx11::string::~string((string *)&inputImage);
  if ((argc == 1) || (sVar16 != 0)) {
    poVar20 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
    std::endl<char,std::char_traits<char>>(poVar20);
    iVar12 = 1;
    goto LAB_001081fb;
  }
  boost::program_options::notify(&vm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputImage,"input",(allocator<char> *)&fs);
  paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
  pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
  std::__cxx11::string::string((string *)&inputPath,(string *)pbVar18);
  std::__cxx11::string::~string((string *)&inputImage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputImage,"model",(allocator<char> *)&fs);
  paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
  pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
  std::__cxx11::string::string((string *)&modelPath,(string *)pbVar18);
  std::__cxx11::string::~string((string *)&inputImage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputImage,"output",(allocator<char> *)&fs);
  paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
  pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
  std::__cxx11::string::string((string *)&outputPath,(string *)pbVar18);
  std::__cxx11::string::~string((string *)&inputImage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputImage,"zoom",(allocator<char> *)&fs);
  paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
  pfVar19 = boost::any_cast<float_const&>(paVar17);
  fVar7 = *pfVar19;
  std::__cxx11::string::~string((string *)&inputImage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputImage,"min-size",(allocator<char> *)&fs);
  paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
  pfVar19 = boost::any_cast<float_const&>(paVar17);
  fVar8 = *pfVar19;
  std::__cxx11::string::~string((string *)&inputImage);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&inputImage,&inputPath,auto_format);
  bVar10 = std::filesystem::is_regular_file((path *)&inputImage);
  std::filesystem::__cxx11::path::~path((path *)&inputImage);
  if (bVar10) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&inputImage,&outputPath,auto_format);
    bVar10 = std::filesystem::is_directory((path *)&inputImage);
    std::filesystem::__cxx11::path::~path((path *)&inputImage);
    if (!bVar10) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&inputImage,&outputPath,auto_format);
      cVar11 = std::filesystem::create_directory((path *)&inputImage);
      std::filesystem::__cxx11::path::~path((path *)&inputImage);
      if (cVar11 == '\0') {
        poVar20 = std::operator<<((ostream *)&std::cerr,(string *)&outputPath);
        pcVar13 = " is not a directory and could not be created.";
        goto LAB_00107d1f;
      }
    }
    local_3d4 = 1;
    cv::imread((string *)&inputImage,(int)&inputPath);
    cVar11 = cv::Mat::empty();
    if (cVar11 == '\0') {
      cv::CascadeClassifier::CascadeClassifier(&cascade);
      bVar10 = std::operator==(&modelPath,"internal");
      if (bVar10) {
        cv::FileStorage::FileStorage(&fs);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_358,
                   "<?xml version=\"1.0\"?>\n<!--\n    Tree-based 20x20 gentle adaboost frontal face detector.\n    Created by Rainer Lienhart.\n\n////////////////////////////////////////////////////////////////////////////////////////\n\n  IMPORTANT: READ BEFORE DOWNLOADING, COPYING, INSTALLING OR USING.\n\n  By downloading, copying, installing or using the software you agree to this license.\n  If you do not agree to this license, do not download, install,\n  copy or use the software.\n\n\n                        Intel License Agreement\n                For Open Source Computer Vision Library\n\n Copyright (C) 2000, Intel Corporation, all rights reserved.\n Third party copyrights are property of their respective owners.\n\n Redistribution and use in source and binary forms, with or without modification,\n are permitted provided that the following conditions are met:\n\n   * Redistribution\'s of source code must retain the above copyright notice,\n     this list of conditions and the following disclaimer.\n\n   * Redistribution\'s in binary form must reproduce the above copyright notice,\n     this list of conditions and the following disclaimer in the documentation\n     and/or other materials provided with the distribution.\n\n   * The name of Intel Corporation may not be used to endorse or promote products\n     derived from this software without specific prior written permission.\n\n This software is provided by the copyright holders and contributors \"as is\" and\n any express or implied warranties, including, but not limited to, the implied\n warranties of merchantability and fitness for a particular purpose are disclaimed.\n In no event shall the Intel Corporation or contributors be liable for any direct,\n indirect, incidental, special, exemplary, or consequential damages\n (including, but not limited to, procurement of substitute goods or services;\n loss of use, data, or profits; or business interruption) however caused\n and on any theory of liability, whether in contract, strict liability,\n or tort (including negligence or otherwise) arising in any way out of\n the ..." /* TRUNCATED STRING LITERAL */
                   ,(allocator<char> *)&local_228);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        local_308._M_string_length = 0;
        local_308.field_2._M_local_buf[0] = '\0';
        cv::FileStorage::open((string *)&fs,(int)&local_358,(string *)0x4);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_358);
        cv::FileStorage::getFirstTopLevelNode();
        cv::CascadeClassifier::read((FileNode *)&cascade);
        cv::FileStorage::~FileStorage(&fs);
LAB_00107e82:
        iVar12 = local_390[1];
        if (local_390[1] < *local_390) {
          iVar12 = *local_390;
        }
        local_180 = (int)(fVar8 * (float)iVar12);
        detectedFaces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._0_16_ = ZEXT416(0);
        detectedFaces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        _fs = 0x1010000;
        local_188 = 0;
        local_17c = local_180;
        poVar20 = (ostream *)
                  cv::CascadeClassifier::detectMultiScale
                            (0x3ff199999999999a,&cascade,&fs,&detectedFaces,3,0,&local_180,
                             &local_188);
        pRVar9 = detectedFaces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pRVar21 = detectedFaces.
                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                       super__Vector_impl_data._M_start; pRVar21 != pRVar9; pRVar21 = pRVar21 + 1) {
          uVar1 = pRVar21->x;
          uVar4 = pRVar21->y;
          uVar2 = pRVar21->width;
          uVar5 = pRVar21->height;
          iVar24 = (int)((float)(int)uVar2 * fVar7);
          iVar25 = (int)((float)(int)uVar5 * fVar7);
          local_200 = CONCAT44(iVar25,iVar24);
          uVar3 = pRVar21->width;
          uVar6 = pRVar21->height;
          iVar22 = (uVar3 - iVar24) / 2 + uVar1;
          iVar23 = (uVar6 - iVar25) / 2 + uVar4;
          local_208 = CONCAT44(iVar23,iVar22);
          auVar26._4_4_ = iVar22;
          auVar26._0_4_ = iVar22;
          auVar26._8_4_ = iVar23;
          auVar26._12_4_ = iVar23;
          iVar12 = movmskpd((int)poVar20,auVar26);
          if (iVar12 == 0) {
            if ((local_390[1] < iVar22 + iVar24) || (*local_390 < iVar23 + iVar25))
            goto LAB_00107fb8;
            std::operator+(&local_228,&outputPath,"/");
            std::__cxx11::to_string(&local_1c0,local_3d4);
            std::operator+(&local_308,&local_228,&local_1c0);
            std::operator+(&local_358,&local_308,".jpg");
            cv::Mat::Mat((Mat *)&fs,&inputImage,(Rect_ *)&local_208);
            local_1d8.sz.width = 0;
            local_1d8.sz.height = 0;
            local_1d8.flags = 0x1010000;
            local_1f8[0] = (vector)0x0;
            local_1f8[1] = (vector)0x0;
            local_1f8[2] = (vector)0x0;
            local_1f8[3] = (vector)0x0;
            local_1f8[4] = (vector)0x0;
            local_1f8[5] = (vector)0x0;
            local_1f8[6] = (vector)0x0;
            local_1f8[7] = (vector)0x0;
            local_1f8[8] = (vector)0x0;
            local_1f8[9] = (vector)0x0;
            local_1f8[10] = (vector)0x0;
            local_1f8[0xb] = (vector)0x0;
            local_1f8[0xc] = (vector)0x0;
            local_1f8[0xd] = (vector)0x0;
            local_1f8[0xe] = (vector)0x0;
            local_1f8[0xf] = (vector)0x0;
            local_1e8 = 0;
            local_1d8.obj = (Mat *)&fs;
            cv::imwrite((string *)&local_358,&local_1d8,local_1f8);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)local_1f8);
            cv::Mat::~Mat((Mat *)&fs);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)&local_308);
            std::__cxx11::string::~string((string *)&local_1c0);
            poVar20 = (ostream *)std::__cxx11::string::~string((string *)&local_228);
            local_3d4 = local_3d4 + 1;
          }
          else {
LAB_00107fb8:
            poVar20 = std::operator<<((ostream *)&std::cerr,"Face ");
            poVar20 = std::operator<<(poVar20,"[");
            poVar20 = (ostream *)std::ostream::operator<<(poVar20,pRVar21->width);
            poVar20 = std::operator<<(poVar20," x ");
            poVar20 = (ostream *)std::ostream::operator<<(poVar20,pRVar21->height);
            poVar20 = std::operator<<(poVar20," from (");
            poVar20 = (ostream *)std::ostream::operator<<(poVar20,pRVar21->x);
            poVar20 = std::operator<<(poVar20,", ");
            poVar20 = (ostream *)std::ostream::operator<<(poVar20,pRVar21->y);
            poVar20 = std::operator<<(poVar20,")]");
            poVar20 = std::operator<<(poVar20," could not be saved (zoom too large)");
            poVar20 = std::endl<char,std::char_traits<char>>(poVar20);
          }
        }
        std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
                  (&detectedFaces.
                    super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
        iVar12 = 0;
      }
      else {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)&fs,&modelPath,auto_format);
        bVar10 = std::filesystem::is_regular_file((path *)&fs);
        std::filesystem::__cxx11::path::~path((path *)&fs);
        if (bVar10) {
          cv::CascadeClassifier::load((string *)&cascade);
          goto LAB_00107e82;
        }
        poVar20 = std::operator<<((ostream *)&std::cerr,(string *)&modelPath);
        poVar20 = std::operator<<(poVar20," does not exist.");
        std::endl<char,std::char_traits<char>>(poVar20);
        iVar12 = -1;
      }
      cv::CascadeClassifier::~CascadeClassifier(&cascade);
    }
    else {
      poVar20 = std::operator<<((ostream *)&std::cerr,(string *)&inputPath);
      poVar20 = std::operator<<(poVar20," couldn\'t be read");
      std::endl<char,std::char_traits<char>>(poVar20);
      iVar12 = -1;
    }
    cv::Mat::~Mat(&inputImage);
  }
  else {
    poVar20 = std::operator<<((ostream *)&std::cerr,(string *)&inputPath);
    pcVar13 = " is not a file.";
LAB_00107d1f:
    poVar20 = std::operator<<(poVar20,pcVar13);
    std::endl<char,std::char_traits<char>>(poVar20);
    iVar12 = -1;
  }
  std::__cxx11::string::~string((string *)&outputPath);
  std::__cxx11::string::~string((string *)&modelPath);
  std::__cxx11::string::~string((string *)&inputPath);
LAB_001081fb:
  boost::program_options::options_description::~options_description(&desc);
  boost::program_options::variables_map::~variables_map(&vm);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argList);
  return iVar12;
}

Assistant:

int main(int argc, char **argv) {
  std::vector<std::string> argList(argv, argv + argc);
  po::variables_map vm;

  // Get options
  po::options_description desc("Options for helium");
  desc.add_options()("help", "produce help message")(
      "input", po::value<std::string>()->required(), "input file")(
      "output", po::value<std::string>()->required()->default_value("out"),
      "output folder")(
      "model", po::value<std::string>()->default_value("internal"),
      "model file ('internal' to use haarcascade_frontalface_alt2)")(
      "zoom", po::value<float>()->default_value(2),
      "zoom factor (0.5 = half size, 2 = double size)")(
      "min-size", po::value<float>()->default_value(0.05, "0.05"),
      "minimum face size (0.05 = 5% of image size, 0.5 = 50% of image "
      "size)");
  po::store(po::parse_command_line(argc, argv, desc), vm);

  // Return help message
  if (vm.count("help") || argc == 1) {
    std::cout << desc << std::endl;
    return 1;
  }

  // Raise errors about incorrect options
  po::notify(vm);

  // Cast variables from  variable map
  const std::string inputPath = vm["input"].as<std::string>();
  const std::string modelPath = vm["model"].as<std::string>();
  const std::string outputPath = vm["output"].as<std::string>();
  const float zoomLevel = vm["zoom"].as<float>();
  const float minimumSize = vm["min-size"].as<float>();

  // Error if input path is not a file
  if (!fs::is_regular_file(inputPath)) {
    std::cerr << inputPath << " is not a file." << std::endl;
    return -1;
  }

  // Ensure the output path exists or can be created
  if (!fs::is_directory(outputPath)) {
    if (!fs::create_directory(outputPath)) {
      std::cerr << outputPath << " is not a directory and could not be created."
                << std::endl;
      return -1;
    }
  }

  // Load the input image
  cv::Mat inputImage = cv::imread(inputPath);

  // Error if image is empty
  if (inputImage.empty()) {
    std::cerr << inputPath << " couldn't be read" << std::endl;
    return -1;
  }

  // Initialize cascade classifier
  CascadeClassifier cascade;

  if (modelPath == "internal") {
    // Open in-memory model
    cv::FileStorage fs;
    fs.open(std::string(cascade_model),
            FileStorage::READ | FileStorage::MEMORY);

    // Load model into cascade classifier
    cascade.read(fs.getFirstTopLevelNode());
  } else {
    // Error if model path is not a file
    if (!fs::is_regular_file(modelPath)) {
      std::cerr << modelPath << " does not exist." << std::endl;
      return -1;
    }

    // Load model into cascade classifier
    cascade.load(modelPath);
  }

  // The minimum size for detected faces is based on the larger of the
  // image's sides multiplied by a ratio
  const int greatestImageSideLength =
      max(inputImage.size().height, inputImage.size().width);
  const int minimumFaceLength = (greatestImageSideLength * minimumSize);
  cv::Size minimumFaceSize = cv::Size(minimumFaceLength, minimumFaceLength);

  // Use the cascade model to detect faces as Rects in detectedFaces
  std::vector<Rect> detectedFaces;
  cascade.detectMultiScale(inputImage, detectedFaces, 1.1, 3, 0,
                           minimumFaceSize);

  // Loop over every detected face
  int imageId = 1;
  for (const Rect &faceArea : detectedFaces) {
    // Set the crop rectangle to the detected face before performing zoom
    // transformation
    Rect cropRectangle = faceArea;

    // Apply the zoom level
    cropRectangle.width = faceArea.width * zoomLevel;
    cropRectangle.height = faceArea.height * zoomLevel;

    cropRectangle.x += ((faceArea.width - cropRectangle.width) / 2);
    cropRectangle.y += ((faceArea.height - cropRectangle.height) / 2);

    // If the new crop rectangle would try to read nonexistent pixels, skip
    if ((cropRectangle.x < 0) || (cropRectangle.y < 0) ||
        ((cropRectangle.x + cropRectangle.width) > inputImage.size().width) ||
        ((cropRectangle.y + cropRectangle.height) > inputImage.size().height)) {
      std::cerr << "Face " << faceArea << " could not be saved (zoom too large)"
                << std::endl;
      continue;
    }

    // Write a cropped version of the image
    cv::imwrite((outputPath + "/" + std::to_string(imageId) + ".jpg"),
                inputImage(cropRectangle));

    imageId++;
  }
  return 0;
}